

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall tcu::x11::XlibWindow::setVisibility(XlibWindow *this,bool visible)

{
  int local_e8 [2];
  XEvent event;
  Display *pDStack_20;
  int eventType;
  Display *dpy;
  XlibWindow *pXStack_10;
  bool visible_local;
  XlibWindow *this_local;
  
  dpy._7_1_ = visible;
  pXStack_10 = this;
  pDStack_20 = XlibDisplay::getXDisplay(this->m_display);
  event.pad[0x17]._4_4_ = 0;
  if ((dpy._7_1_ & 1) != ((this->super_WindowBase).m_visible & 1U)) {
    if ((dpy._7_1_ & 1) == 0) {
      XUnmapWindow(pDStack_20,this->m_window);
      event.pad[0x17]._4_4_ = 0x12;
    }
    else {
      XMapWindow(pDStack_20,this->m_window);
      event.pad[0x17]._4_4_ = 0x13;
    }
    XSelectInput(pDStack_20,this->m_window,0x28000);
    do {
      XWindowEvent(pDStack_20,this->m_window,0x28000,local_e8);
    } while (local_e8[0] != event.pad[0x17]._4_4_);
    (this->super_WindowBase).m_visible = (bool)(dpy._7_1_ & 1);
  }
  return;
}

Assistant:

void XlibWindow::setVisibility (bool visible)
{
	::Display*	dpy			= m_display.getXDisplay();
	int			eventType	= None;
	XEvent		event;

	if (visible == m_visible)
		return;

	if (visible)
	{
		XMapWindow(dpy, m_window);
		eventType = MapNotify;
	}
	else
	{
		XUnmapWindow(dpy, m_window);
		eventType = UnmapNotify;
	}

	// We are only interested about exposure/structure notify events, not user input
	XSelectInput(dpy, m_window, ExposureMask | StructureNotifyMask);

	do
	{
		XWindowEvent(dpy, m_window, ExposureMask | StructureNotifyMask, &event);
	} while (event.type != eventType);

	m_visible = visible;
}